

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManchesterAnalyzer.cpp
# Opt level: O2

void __thiscall ManchesterAnalyzer::SynchronizeBiPhase(ManchesterAnalyzer *this)

{
  U32 UVar1;
  U32 UVar2;
  ManchesterMode MVar3;
  pointer puVar4;
  long lVar5;
  ulong uVar6;
  pointer puVar7;
  pointer puVar8;
  ulong uVar9;
  U64 edge_location;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> locations_to_save;
  value_type local_50;
  _Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_> local_48;
  
  while( true ) {
    while( true ) {
      if (this->mSynchronized != false) {
        return;
      }
      Analyzer::CheckIfThreadShouldExit();
      local_50 = AnalyzerChannelData::GetSampleNumber();
      AnalyzerChannelData::AdvanceToNextEdge();
      lVar5 = AnalyzerChannelData::GetSampleNumber();
      uVar6 = lVar5 - local_50;
      UVar1 = this->mT;
      UVar2 = this->mTError;
      if (UVar2 + UVar1 <= uVar6 || uVar6 <= UVar1 - UVar2) break;
      std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
                (&this->mUnsyncedLocations,&local_50);
    }
    if (uVar6 < UVar2 + UVar1 * 2 && UVar1 * 2 - UVar2 < uVar6) break;
    Invalidate(this);
  }
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
            (&this->mUnsyncedLocations,&local_50);
  this->mSynchronized = true;
  MVar3 = ((this->mSettings)._M_ptr)->mMode;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar7 = (this->mUnsyncedLocations).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar8 = (this->mUnsyncedLocations).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  while (puVar8 != puVar7) {
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
              ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)&local_48,
               puVar8 + -1);
    puVar7 = (this->mUnsyncedLocations).
             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar4 = (this->mUnsyncedLocations).
             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar8 = puVar4 + -1;
    (this->mUnsyncedLocations).
    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar8;
    if (puVar8 != puVar7) {
      puVar8 = puVar4 + -2;
      (this->mUnsyncedLocations).
      super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar8;
    }
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<unsigned_long_long*,std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_48._M_impl.super__Vector_impl_data._M_start,
             local_48._M_impl.super__Vector_impl_data._M_finish);
  uVar6 = (ulong)((long)local_48._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_48._M_impl.super__Vector_impl_data._M_start) >> 3;
  for (uVar9 = 0; (uVar6 & 0xffffffff) != uVar9; uVar9 = uVar9 + 1) {
    SaveBit(this,local_48._M_impl.super__Vector_impl_data._M_start[uVar9],
            (uint)(((int)uVar6 - 1 == uVar9) != (MVar3 == BI_PHASE_MARK)));
  }
  std::_Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~_Vector_base
            (&local_48);
  return;
}

Assistant:

void ManchesterAnalyzer::SynchronizeBiPhase()
{
    while( mSynchronized == false )
    {
        CheckIfThreadShouldExit();
        U64 edge_location = mManchester->GetSampleNumber();
        mManchester->AdvanceToNextEdge();
        U64 next_edge_location = mManchester->GetSampleNumber();
        U64 edge_distance = next_edge_location - edge_location;
        if( ( edge_distance > ( mT - mTError ) ) && ( edge_distance < ( mT + mTError ) ) ) // short
        {
            mUnsyncedLocations.push_back( edge_location );
        }
        else if( ( edge_distance > ( ( 2 * mT ) - mTError ) ) && ( edge_distance < ( ( 2 * mT ) + mTError ) ) ) // long
        {
            mUnsyncedLocations.push_back( edge_location );
            mSynchronized = true;
            U32 bit_value = 0;
            if( mSettings->mMode == BI_PHASE_MARK ) // FM1
                bit_value = 1;
            else if( mSettings->mMode == BI_PHASE_SPACE ) // FM0
                bit_value = 0;

            std::vector<U64> locations_to_save;
            while( mUnsyncedLocations.size() > 0 )
            {
                locations_to_save.push_back( mUnsyncedLocations.back() );
                mUnsyncedLocations.pop_back();
                if( mUnsyncedLocations.size() > 0 )
                    mUnsyncedLocations.pop_back();
            }
            std::sort( locations_to_save.begin(), locations_to_save.end() );
            U32 count = locations_to_save.size();
            for( U32 i = 0; i < count; ++i )
            {
                if( i == ( count - 1 ) )
                    SaveBit( locations_to_save[ i ], bit_value ^ 0x1 );
                else
                    SaveBit( locations_to_save[ i ], bit_value );
            }
            break;
        }
        else
        {
            // back to idle.
            Invalidate();
        }
    }
}